

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberParser.cpp
# Opt level: O1

void __thiscall
slang::parsing::NumberParser::NumberParser
          (NumberParser *this,Diagnostics *diagnostics,BumpAllocator *alloc,
          LanguageVersion languageVersion)

{
  this->sizeBits = 0;
  this->literalBase = Binary;
  this->languageVersion = languageVersion;
  (this->decimalValue).super_SVIntStorage.field_0.val = 0;
  *(undefined4 *)&(this->firstLocation).field_0x7 = 0;
  this->firstLocation = (SourceLocation)0x0;
  (this->decimalValue).super_SVIntStorage.bitWidth = 1;
  (this->decimalValue).super_SVIntStorage.signFlag = false;
  (this->decimalValue).super_SVIntStorage.unknownFlag = false;
  this->diagnostics = diagnostics;
  this->alloc = alloc;
  (this->digits).super_SmallVectorBase<slang::logic_t>.data_ =
       (pointer)(this->digits).super_SmallVectorBase<slang::logic_t>.firstElement;
  (this->digits).super_SmallVectorBase<slang::logic_t>.len = 0;
  (this->digits).super_SmallVectorBase<slang::logic_t>.cap = 0x28;
  (this->text).super_SmallVectorBase<char>.data_ =
       (this->text).super_SmallVectorBase<char>.firstElement;
  (this->text).super_SmallVectorBase<char>.len = 0;
  (this->text).super_SmallVectorBase<char>.cap = 0x28;
  return;
}

Assistant:

NumberParser::NumberParser(Diagnostics& diagnostics, BumpAllocator& alloc,
                           LanguageVersion languageVersion) :
    languageVersion(languageVersion), diagnostics(diagnostics), alloc(alloc) {
}